

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shproduct.hpp
# Opt level: O0

matrix<225> * __thiscall SH<15>::prodMatrix(matrix<225> *__return_storage_ptr__,SH<15> *this)

{
  undefined2 uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  bool bVar4;
  int iVar5;
  reference pTVar6;
  short local_44;
  short sStack_42;
  short sStack_40;
  TensorEntry e;
  iterator __end1;
  iterator __begin1;
  vector<TensorEntry,_std::allocator<TensorEntry>_> *__range1;
  SH<15> *this_local;
  
  if (prodMatrix()::SparseGamma == '\0') {
    iVar5 = __cxa_guard_acquire(&prodMatrix()::SparseGamma);
    if (iVar5 != 0) {
      readGamma(&prodMatrix::SparseGamma,0xf);
      __cxa_atexit(std::vector<TensorEntry,_std::allocator<TensorEntry>_>::~vector,
                   &prodMatrix::SparseGamma,&__dso_handle);
      __cxa_guard_release(&prodMatrix()::SparseGamma);
    }
  }
  matrix<225>::matrix(__return_storage_ptr__);
  __end1 = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::begin(&prodMatrix::SparseGamma);
  e._4_8_ = std::vector<TensorEntry,_std::allocator<TensorEntry>_>::end(&prodMatrix::SparseGamma);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<TensorEntry_*,_std::vector<TensorEntry,_std::allocator<TensorEntry>_>_>
                                *)&e.c);
    if (!bVar4) break;
    pTVar6 = __gnu_cxx::
             __normal_iterator<TensorEntry_*,_std::vector<TensorEntry,_std::allocator<TensorEntry>_>_>
             ::operator*(&__end1);
    uVar1 = pTVar6->a;
    uVar2 = pTVar6->b;
    uVar3 = pTVar6->c;
    e._0_4_ = pTVar6->val;
    __return_storage_ptr__->a[(short)uVar1][(short)uVar2] =
         (float)e._0_4_ * this->a[(short)uVar3] +
         __return_storage_ptr__->a[(short)uVar1][(short)uVar2];
    __gnu_cxx::
    __normal_iterator<TensorEntry_*,_std::vector<TensorEntry,_std::allocator<TensorEntry>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

matrix<n*n> SH<n>::prodMatrix() const
{
    static std::vector<TensorEntry> SparseGamma = readGamma(n);
    matrix<n*n> m;
    for (auto e: SparseGamma)
    	m.a[e.a][e.b] += e.val * a[e.c];
    return m;
}